

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indented_writer.h
# Opt level: O2

void __thiscall ctemplate::IndentedWriter::IndentLine(IndentedWriter *this)

{
  string *psVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->line_state_ == AT_BEGINNING) {
    psVar1 = this->out_;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_58,(char)this->current_indentation_);
    pcVar2 = "\", ";
    if (this->current_indentation_ == 0) {
      pcVar2 = "\"\n";
    }
    std::operator+(&local_38,&local_58,pcVar2 + 2);
    std::__cxx11::string::append((string *)psVar1);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    return;
  }
  __assert_fail("line_state_ == AT_BEGINNING",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/indented_writer.h"
                ,0x74,"void ctemplate::IndentedWriter::IndentLine()");
}

Assistant:

void IndentLine() {
    assert(line_state_ == AT_BEGINNING);
    out_->append(string(current_indentation_, ' ') +
                 (current_indentation_ ? " " : ""));
  }